

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

char __thiscall Fl_Preferences::set(Fl_Preferences *this,char *key,void *data,int dsize)

{
  byte bVar1;
  char *value;
  char *pcVar2;
  int iVar3;
  
  value = (char *)malloc((long)(dsize * 2 + 1));
  pcVar2 = value;
  if (0 < dsize) {
    iVar3 = dsize + 1;
    do {
      bVar1 = *data;
      data = (void *)((long)data + 1);
      *pcVar2 = "0123456789abcdef"[bVar1 >> 4];
      pcVar2[1] = "0123456789abcdef"[bVar1 & 0xf];
      pcVar2 = pcVar2 + 2;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  *pcVar2 = '\0';
  Node::set(this->node,key,value);
  free(value);
  return '\x01';
}

Assistant:

char Fl_Preferences::set( const char *key, const void *data, int dsize ) {
  char *buffer = (char*)malloc( dsize*2+1 ), *d = buffer;;
  unsigned char *s = (unsigned char*)data;
  for ( ; dsize>0; dsize-- ) {
    static char lu[] = "0123456789abcdef";
    unsigned char v = *s++;
    *d++ = lu[v>>4];
    *d++ = lu[v&0xf];
  }
  *d = 0;
  node->set( key, buffer );
  free( buffer );
  return 1;
}